

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

void kratos::CheckFlipFlopAlwaysFFVisitor::check_always_ff(SequentialStmtBlock *stmt)

{
  pointer psVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  StmtException *this_00;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  initializer_list<kratos::IRNode_*> __l;
  SequentialStmtBlock *local_78;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_70;
  string local_58;
  allocator_type local_31;
  
  lVar5 = (long)(stmt->super_StmtBlock).stmts_.
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(stmt->super_StmtBlock).stmts_.
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar5 != 0) {
    lVar6 = 8;
    uVar4 = 1;
    do {
      psVar1 = (stmt->super_StmtBlock).stmts_.
               super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = *(long *)((long)psVar1 + lVar6 + -8);
      this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&(psVar1->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              + lVar6);
      if (this == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar3 = *(int *)(lVar2 + 0x78);
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
        iVar3 = *(int *)(lVar2 + 0x78);
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (iVar3 == 0) break;
      lVar6 = lVar6 + 0x10;
      bVar7 = uVar4 < (ulong)(lVar5 >> 4);
      uVar4 = uVar4 + 1;
    } while (bVar7);
    if ((iVar3 == 0) &&
       (0x10 < (ulong)((long)(stmt->super_StmtBlock).stmts_.
                             super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(stmt->super_StmtBlock).stmts_.
                            super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                            ._M_impl.super__Vector_impl_data._M_start))) {
      this_00 = (StmtException *)__cxa_allocate_exception(0x10);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,anon_var_dwarf_611741,anon_var_dwarf_611741 + 0xb2);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_78;
      local_78 = stmt;
      std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                (&local_70,__l,&local_31);
      StmtException::StmtException(this_00,&local_58,&local_70);
      __cxa_throw(this_00,&StmtException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void static check_always_ff(SequentialStmtBlock* stmt) {
        // first pass to determine if there is any if statement in top level
        bool has_if = false;
        uint64_t i = 0;
        uint64_t stmt_count = stmt->size();
        while ((!has_if) && (i < stmt_count)) {
            auto s = stmt->get_stmt(i);
            if (s->type() == StatementType::If) has_if = true;
            i++;
        }
        if (has_if && stmt->size() > 1) {
            // DC cannot infer as a D-flip-flop
            // error message copied from DC
            throw StmtException(
                "The statements in this 'always' block are outside the "
                "scope of the synthesis policy. Only an ’if’ statement "
                "is allowed at the top level in this ’always’ block. (ELAB-302)",
                {stmt});
        }
    }